

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _func_int *p_Var4;
  size_t _elemsize;
  Layer *pLVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int _w;
  Convolution *pCVar10;
  Mat bottom_blob_bordered;
  
  if (bottom_blob->dims == 3) {
    if ((opt->use_int8_inference == true) &&
       (*(long *)(&this->field_0x148 + (long)this->_vptr_Convolution_x86[-3]) == 1)) {
      iVar7 = forward_int8_x86(this,bottom_blob,top_blob,opt);
      return iVar7;
    }
    p_Var4 = this->_vptr_Convolution_x86[-3];
    pCVar10 = (Convolution *)((long)&this->_vptr_Convolution_x86 + (long)p_Var4);
    iVar7 = *(int *)(p_Var4 + 4 + (long)&(this->weight_3x3_winograd23_data_int8).data);
    if ((((iVar7 < 2) && (pCVar10->dilation_h < 2)) ||
        ((pCVar10->stride_w < 2 && (pCVar10->stride_h < 2)))) &&
       (((iVar7 < 2 && (pCVar10->dilation_h < 2)) || (iVar7 == pCVar10->dilation_h)))) {
      _elemsize = bottom_blob->elemsize;
      iVar1 = pCVar10->kernel_w;
      iVar9 = pCVar10->kernel_h;
      iVar2 = pCVar10->dilation_h;
      bottom_blob_bordered.elemsize._0_4_ = 0;
      bottom_blob_bordered._20_8_ = 0;
      bottom_blob_bordered.data = (void *)0x0;
      bottom_blob_bordered.refcount._0_4_ = 0;
      bottom_blob_bordered.refcount._4_4_ = 0;
      bottom_blob_bordered.allocator = (Allocator *)0x0;
      bottom_blob_bordered.dims = 0;
      bottom_blob_bordered.w = 0;
      bottom_blob_bordered.h = 0;
      bottom_blob_bordered.c = 0;
      bottom_blob_bordered.cstep = 0;
      Convolution::make_padding
                ((Convolution *)
                 ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),
                 bottom_blob,&bottom_blob_bordered,opt);
      iVar8 = -100;
      if ((bottom_blob_bordered.data != (void *)0x0) &&
         ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
        p_Var4 = this->_vptr_Convolution_x86[-3];
        iVar7 = (~((iVar1 + -1) * iVar7) + bottom_blob_bordered.w) /
                *(int *)(p_Var4 + 0xc + (long)&(this->weight_3x3_winograd23_data_int8).data);
        _w = iVar7 + 1;
        iVar1 = (~((iVar9 + -1) * iVar2) + bottom_blob_bordered.h) /
                *(int *)(p_Var4 + 0x10 + (long)&(this->weight_3x3_winograd23_data_int8).data);
        iVar9 = iVar1 + 1;
        Mat::create(top_blob,_w,iVar9,*(int *)(&this->use_winograd3x3_int8 + (long)p_Var4),_elemsize
                    ,opt->blob_allocator);
        iVar8 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          p_Var4 = this->_vptr_Convolution_x86[-3];
          pCVar10 = (Convolution *)((long)&this->_vptr_Convolution_x86 + (long)p_Var4);
          iVar2 = *(int *)(&this->field_0xbc + (long)p_Var4);
          iVar8 = *(int *)(p_Var4 + (long)&(this->weight_3x3_winograd23_data_int8).data);
          if ((((iVar2 == iVar8) && (iVar3 = pCVar10->dilation_w, iVar3 != 1)) &&
              (pCVar10->dilation_h == iVar3)) &&
             ((pCVar10->stride_w == 1 && (pCVar10->stride_h == 1)))) {
            if ((_w < iVar3) || (iVar9 < pCVar10->dilation_h)) {
              iVar8 = Convolution::forward(pCVar10,bottom_blob,top_blob,opt);
            }
            else {
              iVar8 = forwardDilation_x86(this,&bottom_blob_bordered,top_blob,opt);
            }
          }
          else {
            if ((iVar8 == 3 && iVar2 == 3) &&
               (((pCVar10->dilation_w == 1 && (pCVar10->dilation_h == 1)) &&
                ((pCVar10->stride_w == 1 && (pCVar10->stride_h == 1)))))) {
              if (((iVar1 < 7) || (iVar7 < 7)) || (this->use_winograd3x3 == false)) {
                conv_im2col_sgemm_sse
                          (&bottom_blob_bordered,top_blob,&this->weight_sgemm_data,
                           &pCVar10->bias_data,3,3,1,1,opt);
              }
              else {
                conv3x3s1_winograd23_sse
                          (&bottom_blob_bordered,top_blob,&this->weight_3x3_winograd23_data,
                           &pCVar10->bias_data,opt);
              }
            }
            else {
              conv_im2col_sgemm_sse
                        (&bottom_blob_bordered,top_blob,&this->weight_sgemm_data,&pCVar10->bias_data
                         ,iVar2,iVar8,pCVar10->stride_w,pCVar10->stride_h,opt);
            }
            pLVar5 = this->activation;
            if (pLVar5 != (Layer *)0x0) {
              (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob,opt);
            }
            iVar8 = 0;
          }
        }
      }
      piVar6 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,
                               bottom_blob_bordered.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (bottom_blob_bordered.allocator == (Allocator *)0x0) {
            if (bottom_blob_bordered.data != (void *)0x0) {
              free(bottom_blob_bordered.data);
            }
          }
          else {
            (**(code **)(*(long *)bottom_blob_bordered.allocator + 0x18))();
          }
        }
      }
      return iVar8;
    }
  }
  else {
    pCVar10 = (Convolution *)
              ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
  }
  iVar7 = Convolution::forward(pCVar10,bottom_blob,top_blob,opt);
  return iVar7;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }

    if ((dilation_w > 1 || dilation_h > 1) && (stride_w > 1 || stride_h > 1))
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if ((dilation_w > 1 || dilation_h > 1) && dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw < dilation_w || outh < dilation_h)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
    }

    if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (use_winograd3x3 && outw >= 8 && outh >=8)
        {
            conv3x3s1_winograd23_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
//             conv3x3s1_winograd43_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd43_data, bias_data, opt);
        }
        else
        {
            conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }
    else
    {
//         conv1x1s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv1x1s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv5x5s1_neon(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

        conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}